

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O3

TransferFormat glu::getTransferFormat(TextureFormat texFormat)

{
  byte bVar1;
  long lVar2;
  TransferFormat TVar3;
  InternalError *this;
  long lVar4;
  ulong uVar5;
  string local_40;
  
  uVar5 = 0x2f8200000 >> ((byte)texFormat.type & 0x3f);
  lVar4 = 0;
  if (DS < texFormat.order) goto switchD_018c4b7d_caseD_2;
  bVar1 = texFormat.type >> 1 < 0x11 & (byte)uVar5;
  uVar5 = (long)&switchD_018c4b7d::switchdataD_01cc0d10 +
          (long)(int)(&switchD_018c4b7d::switchdataD_01cc0d10)[(ulong)texFormat & 0xffffffff];
  switch((ulong)texFormat & 0xffffffff) {
  case 0:
    lVar2 = 0x8d94;
    lVar4 = 0x1903;
    goto LAB_018c4bd1;
  case 1:
    lVar4 = 0x1906;
    break;
  case 3:
    lVar4 = 0x1909;
    break;
  case 4:
    lVar4 = 0x190a;
    break;
  case 5:
    lVar4 = (ulong)bVar1 + 0x8227;
    break;
  case 7:
    lVar2 = 0x8d98;
    lVar4 = 0x1907;
    goto LAB_018c4bd1;
  case 8:
    lVar2 = 0x8d99;
    lVar4 = 0x1908;
LAB_018c4bd1:
    if (bVar1 != 0) {
      lVar4 = lVar2;
    }
    break;
  case 0xb:
    lVar4 = 0x80e1;
    break;
  case 0xc:
    lVar4 = 0x1903;
    break;
  case 0xd:
    lVar4 = 0x8227;
    break;
  case 0xe:
    lVar4 = 0x1907;
    break;
  case 0xf:
    lVar4 = 0x1908;
    break;
  case 0x12:
    lVar4 = 0x1902;
    break;
  case 0x13:
    lVar4 = 0x1901;
    break;
  case 0x14:
    lVar4 = 0x84f9;
  }
switchD_018c4b7d_caseD_2:
  if (FLOAT_UNSIGNED_INT_24_8_REV < texFormat.type) {
    this = (InternalError *)__cxa_allocate_exception(0x38,uVar5,lVar4);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Can\'t map texture format to GL transfer format","");
    tcu::InternalError::InternalError(this,&local_40);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  TVar3 = (TransferFormat)
          (*(code *)(&DAT_01cc0d64 + *(int *)(&DAT_01cc0d64 + ((ulong)texFormat >> 0x20) * 4)))();
  return TVar3;
}

Assistant:

TransferFormat getTransferFormat (tcu::TextureFormat texFormat)
{
	using tcu::TextureFormat;

	deUint32	format	= GL_NONE;
	deUint32	type	= GL_NONE;
	bool		isInt	= false;

	switch (texFormat.type)
	{
		case TextureFormat::SIGNED_INT8:
		case TextureFormat::SIGNED_INT16:
		case TextureFormat::SIGNED_INT32:
		case TextureFormat::UNSIGNED_INT8:
		case TextureFormat::UNSIGNED_INT16:
		case TextureFormat::UNSIGNED_INT32:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
			isInt = true;
			break;

		default:
			isInt = false;
			break;
	}

	switch (texFormat.order)
	{
		case TextureFormat::A:		format = GL_ALPHA;								break;
		case TextureFormat::L:		format = GL_LUMINANCE;							break;
		case TextureFormat::LA:		format = GL_LUMINANCE_ALPHA;					break;
		case TextureFormat::R:		format = isInt ? GL_RED_INTEGER		: GL_RED;	break;
		case TextureFormat::RG:		format = isInt ? GL_RG_INTEGER		: GL_RG;	break;
		case TextureFormat::RGB:	format = isInt ? GL_RGB_INTEGER		: GL_RGB;	break;
		case TextureFormat::RGBA:	format = isInt ? GL_RGBA_INTEGER	: GL_RGBA;	break;
		case TextureFormat::sR:		format = GL_RED;								break;
		case TextureFormat::sRG:	format = GL_RG;									break;
		case TextureFormat::sRGB:	format = GL_RGB;								break;
		case TextureFormat::sRGBA:	format = GL_RGBA;								break;
		case TextureFormat::D:		format = GL_DEPTH_COMPONENT;					break;
		case TextureFormat::DS:		format = GL_DEPTH_STENCIL;						break;
		case TextureFormat::S:		format = GL_STENCIL_INDEX;						break;

		case TextureFormat::BGRA:
			DE_ASSERT(!isInt);
			format = GL_BGRA;
			break;

		default:
			DE_ASSERT(false);
	}

	switch (texFormat.type)
	{
		case TextureFormat::SNORM_INT8:						type = GL_BYTE;								break;
		case TextureFormat::SNORM_INT16:					type = GL_SHORT;							break;
		case TextureFormat::UNORM_INT8:						type = GL_UNSIGNED_BYTE;					break;
		case TextureFormat::UNORM_INT16:					type = GL_UNSIGNED_SHORT;					break;
		case TextureFormat::UNORM_SHORT_565:				type = GL_UNSIGNED_SHORT_5_6_5;				break;
		case TextureFormat::UNORM_SHORT_4444:				type = GL_UNSIGNED_SHORT_4_4_4_4;			break;
		case TextureFormat::UNORM_SHORT_5551:				type = GL_UNSIGNED_SHORT_5_5_5_1;			break;
		case TextureFormat::SIGNED_INT8:					type = GL_BYTE;								break;
		case TextureFormat::SIGNED_INT16:					type = GL_SHORT;							break;
		case TextureFormat::SIGNED_INT32:					type = GL_INT;								break;
		case TextureFormat::UNSIGNED_INT8:					type = GL_UNSIGNED_BYTE;					break;
		case TextureFormat::UNSIGNED_INT16:					type = GL_UNSIGNED_SHORT;					break;
		case TextureFormat::UNSIGNED_INT32:					type = GL_UNSIGNED_INT;						break;
		case TextureFormat::FLOAT:							type = GL_FLOAT;							break;
		case TextureFormat::UNORM_INT_101010:				type = GL_UNSIGNED_INT_2_10_10_10_REV;		break;
		case TextureFormat::UNORM_INT_1010102_REV:			type = GL_UNSIGNED_INT_2_10_10_10_REV;		break;
		case TextureFormat::UNSIGNED_INT_1010102_REV:		type = GL_UNSIGNED_INT_2_10_10_10_REV;		break;
		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	type = GL_UNSIGNED_INT_10F_11F_11F_REV;		break;
		case TextureFormat::UNSIGNED_INT_999_E5_REV:		type = GL_UNSIGNED_INT_5_9_9_9_REV;			break;
		case TextureFormat::HALF_FLOAT:						type = GL_HALF_FLOAT;						break;
		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:	type = GL_FLOAT_32_UNSIGNED_INT_24_8_REV;	break;
		case TextureFormat::UNSIGNED_INT_24_8:				type = texFormat.order == TextureFormat::D
																 ? GL_UNSIGNED_INT
																 : GL_UNSIGNED_INT_24_8;				break;

		default:
			throw tcu::InternalError("Can't map texture format to GL transfer format");
	}

	return TransferFormat(format, type);
}